

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

string_class * __thiscall
DivideTest<unsigned_long>::testcase_name_abi_cxx11_(DivideTest<unsigned_long> *this,int algo)

{
  int in_EDX;
  allocator<char> *in_RSI;
  string_class *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string_class *result;
  allocator<char> local_16;
  undefined1 local_15;
  int local_14;
  string_class *__s;
  
  local_15 = 0;
  local_14 = in_EDX;
  __s = in_RDI;
  type_tag<unsigned_long>::get_tag();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,in_RSI);
  std::allocator<char>::~allocator(&local_16);
  if (local_14 == 1) {
    std::__cxx11::string::operator+=((string *)in_RDI," (branchfree)");
  }
  return in_RDI;
}

Assistant:

string_class testcase_name(int algo) const {
        string_class result = type_tag<T>::get_tag();
        if (algo == BRANCHFREE) {
            result += " (branchfree)";
        }
        return result;
    }